

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatUtils.h
# Opt level: O2

void xSAT_UtilSort(void **pArray,int nSize,_func_int_void_ptr_void_ptr *CompFnct)

{
  void *pvVar1;
  void *p1;
  void *p2;
  int iVar2;
  _func_int_void_ptr_void_ptr *CompFnct_00;
  void **ppvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  
  for (; 0xf < nSize; nSize = nSize - (int)lVar9) {
    pvVar1 = pArray[(uint)nSize >> 1];
    lVar9 = -1;
    uVar5 = (ulong)(uint)nSize;
    while( true ) {
      lVar9 = (long)(int)lVar9;
      ppvVar3 = pArray + lVar9;
      do {
        lVar9 = lVar9 + 1;
        p1 = ppvVar3[1];
        ppvVar3 = ppvVar3 + 1;
        iVar2 = xSAT_ClauseCompare(p1,pvVar1);
      } while (iVar2 != 0);
      uVar5 = (ulong)(int)uVar5;
      do {
        p2 = pArray[uVar5 - 1];
        uVar5 = uVar5 - 1;
        iVar2 = xSAT_ClauseCompare(pvVar1,p2);
      } while (iVar2 != 0);
      if ((long)uVar5 <= lVar9) break;
      *ppvVar3 = p2;
      pArray[uVar5] = p1;
    }
    xSAT_UtilSort(pArray,(int)lVar9,CompFnct_00);
    pArray = ppvVar3;
  }
  uVar8 = 1;
  if (1 < nSize) {
    uVar8 = nSize;
  }
  uVar5 = 1;
  for (uVar4 = 0; uVar4 != uVar8 - 1; uVar4 = uVar4 + 1) {
    uVar6 = uVar4 & 0xffffffff;
    for (uVar7 = uVar5; iVar2 = (int)uVar6, (uint)nSize != uVar7; uVar7 = uVar7 + 1) {
      iVar2 = xSAT_ClauseCompare(pArray[uVar7],pArray[iVar2]);
      if (iVar2 != 0) {
        uVar6 = uVar7 & 0xffffffff;
      }
    }
    pvVar1 = pArray[uVar4];
    pArray[uVar4] = pArray[iVar2];
    pArray[iVar2] = pvVar1;
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

static void xSAT_UtilSort( void** pArray, int nSize, int(* CompFnct )( const void *, const void *) )
{
    if ( nSize <= 15 )
        xSAT_UtilSelectSort( pArray, nSize, CompFnct );
    else
    {
        void* pPivot = pArray[nSize / 2];
        void* pTmp;
        int i = -1;
        int j = nSize;

        for(;;)
        {
            do i++; while( CompFnct( pArray[i], pPivot ) );
            do j--; while( CompFnct( pPivot, pArray[j] ) );

            if ( i >= j )
                break;

            pTmp = pArray[i];
            pArray[i] = pArray[j];
            pArray[j] = pTmp;
        }

        xSAT_UtilSort( pArray, i, CompFnct );
        xSAT_UtilSort( pArray + i, ( nSize - i ), CompFnct );
    }
}